

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
gtl::internal_btree::
btree<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
::rebalance_or_split
          (btree<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
           *this,iterator *iter)

{
  btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
  *pbVar1;
  btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
  *pbVar2;
  btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
  *pbVar3;
  node_type *dest;
  int iVar4;
  char *__function;
  byte bVar5;
  byte bVar6;
  uint to_move;
  btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
  bVar7;
  iterator parent_iter;
  iterator local_38;
  
  pbVar3 = iter->node;
  if (((ulong)pbVar3 & 7) == 0) {
    bVar7 = (btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
             )0xf;
    if (pbVar3[0xb] !=
        (btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
         )0x0) {
      bVar7 = pbVar3[0xb];
    }
    if (pbVar3[10] != bVar7) {
      __assert_fail("node->count() == node->max_count()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x82e,
                    "void gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Loop *, std::pair<int, bool>, std::less<S2Loop *>, std::allocator<std::pair<S2Loop *const, std::pair<int, bool>>>, 256, false>>::rebalance_or_split(iterator *) [Params = gtl::internal_btree::map_params<S2Loop *, std::pair<int, bool>, std::less<S2Loop *>, std::allocator<std::pair<S2Loop *const, std::pair<int, bool>>>, 256, false>]"
                   );
    }
    if (pbVar3[10] !=
        (btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
         )0xf) {
      __assert_fail("kNodeValues == node->max_count()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x82f,
                    "void gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Loop *, std::pair<int, bool>, std::less<S2Loop *>, std::allocator<std::pair<S2Loop *const, std::pair<int, bool>>>, 256, false>>::rebalance_or_split(iterator *) [Params = gtl::internal_btree::map_params<S2Loop *, std::pair<int, bool>, std::less<S2Loop *>, std::allocator<std::pair<S2Loop *const, std::pair<int, bool>>>, 256, false>]"
                   );
    }
    pbVar2 = *(btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
               **)pbVar3;
    if (pbVar3 == (this->root_).
                  super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
                  .
                  super_Storage<absl::container_internal::CompressedTuple<std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>_*>,_2UL,_false>
                  .value) {
      pbVar3 = (btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                *)absl::container_internal::
                  Allocate<8ul,std::allocator<std::pair<S2Loop*const,std::pair<int,bool>>>>
                            ((allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_> *)this,
                             0x180);
      pbVar2 = btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
               ::init_internal(pbVar3,pbVar2);
      btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
      ::init_child(pbVar2,0,(this->root_).
                            super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
                            .
                            super_Storage<absl::container_internal::CompressedTuple<std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>_*>,_2UL,_false>
                            .value);
      (this->root_).
      super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
      .
      super_Storage<absl::container_internal::CompressedTuple<std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>_*>,_2UL,_false>
      .value = pbVar2;
      pbVar3 = btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
               ::child(pbVar2,0);
      if (((ulong)pbVar3 & 7) == 0) {
        if ((pbVar3[0xb] !=
             (btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
              )0x0) &&
           (pbVar3 = btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                     ::child(pbVar2,0), pbVar3 != this->rightmost_)) {
          __assert_fail("!parent->child(0)->leaf() || parent->child(0) == rightmost_",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                        ,0x87b,
                        "void gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Loop *, std::pair<int, bool>, std::less<S2Loop *>, std::allocator<std::pair<S2Loop *const, std::pair<int, bool>>>, 256, false>>::rebalance_or_split(iterator *) [Params = gtl::internal_btree::map_params<S2Loop *, std::pair<int, bool>, std::less<S2Loop *>, std::allocator<std::pair<S2Loop *const, std::pair<int, bool>>>, 256, false>]"
                       );
        }
LAB_001d1277:
        if (((ulong)iter->node & 7) == 0) {
          if (iter->node[0xb] ==
              (btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
               )0x0) {
            pbVar3 = (btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                      *)absl::container_internal::
                        Allocate<8ul,std::allocator<std::pair<S2Loop*const,std::pair<int,bool>>>>
                                  ((allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_> *)
                                   this,0x180);
            dest = btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                   ::init_internal(pbVar3,pbVar2);
            btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
            ::split(iter->node,iter->position,dest,(allocator_type *)this);
          }
          else {
            dest = new_leaf_node(this,pbVar2);
            btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
            ::split(iter->node,iter->position,dest,(allocator_type *)this);
            if (this->rightmost_ == iter->node) {
              this->rightmost_ = dest;
            }
          }
          if (((ulong)iter->node & 7) == 0) {
            bVar7 = iter->node[10];
            if ((int)(uint)(byte)bVar7 < iter->position) {
              iter->position = iter->position + ~(uint)(byte)bVar7;
              iter->node = dest;
            }
            return;
          }
        }
      }
    }
    else {
      if (pbVar3[8] !=
          (btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
           )0x0) {
        pbVar1 = btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                 ::child(pbVar2,(byte)pbVar3[8] - 1);
        if (((ulong)pbVar1 & 7) != 0) goto LAB_001d1368;
        if ((pbVar1[0xb] !=
             (btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
              )0x0) &&
           (pbVar1[0xb] !=
            (btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
             )0xf)) {
          __assert_fail("left->max_count() == kNodeValues",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                        ,0x837,
                        "void gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Loop *, std::pair<int, bool>, std::less<S2Loop *>, std::allocator<std::pair<S2Loop *const, std::pair<int, bool>>>, 256, false>>::rebalance_or_split(iterator *) [Params = gtl::internal_btree::map_params<S2Loop *, std::pair<int, bool>, std::less<S2Loop *>, std::allocator<std::pair<S2Loop *const, std::pair<int, bool>>>, 256, false>]"
                       );
        }
        bVar7 = pbVar1[10];
        if ((byte)bVar7 < 0xf) {
          bVar5 = (byte)(0xfU - (char)bVar7) >> (iter->position < 0xf);
          bVar6 = 1;
          if (1 < bVar5) {
            bVar6 = bVar5;
          }
          pbVar3 = iter->node;
          if ((byte)((char)bVar7 + bVar6) < 0xf || (int)(uint)bVar6 <= iter->position) {
            to_move = (uint)bVar6;
            btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
            ::rebalance_right_to_left(pbVar1,to_move,pbVar3,(allocator_type *)this);
            pbVar3 = iter->node;
            if (((ulong)pbVar3 & 7) == 0) {
              bVar7 = (btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                       )0xf;
              if (pbVar3[0xb] !=
                  (btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                   )0x0) {
                bVar7 = pbVar3[0xb];
              }
              if ((uint)(byte)bVar7 - (uint)(byte)pbVar3[10] == to_move) {
                iVar4 = iter->position - to_move;
                iter->position = iVar4;
                if (iVar4 < 0) {
                  iter->position = (uint)(byte)pbVar1[10] + iVar4 + 1;
                  iter->node = pbVar1;
                  pbVar3 = pbVar1;
                }
                bVar7 = (btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                         )0xf;
                if (pbVar3[0xb] !=
                    (btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                     )0x0) {
                  bVar7 = pbVar3[0xb];
                }
                if ((byte)pbVar3[10] < (byte)bVar7) {
                  return;
                }
                __assert_fail("node->count() < node->max_count()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                              ,0x84b,
                              "void gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Loop *, std::pair<int, bool>, std::less<S2Loop *>, std::allocator<std::pair<S2Loop *const, std::pair<int, bool>>>, 256, false>>::rebalance_or_split(iterator *) [Params = gtl::internal_btree::map_params<S2Loop *, std::pair<int, bool>, std::less<S2Loop *>, std::allocator<std::pair<S2Loop *const, std::pair<int, bool>>>, 256, false>]"
                             );
              }
              __assert_fail("node->max_count() - node->count() == to_move",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                            ,0x844,
                            "void gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Loop *, std::pair<int, bool>, std::less<S2Loop *>, std::allocator<std::pair<S2Loop *const, std::pair<int, bool>>>, 256, false>>::rebalance_or_split(iterator *) [Params = gtl::internal_btree::map_params<S2Loop *, std::pair<int, bool>, std::less<S2Loop *>, std::allocator<std::pair<S2Loop *const, std::pair<int, bool>>>, 256, false>]"
                           );
            }
            goto LAB_001d1368;
          }
        }
        else {
          pbVar3 = iter->node;
        }
      }
      if ((((ulong)pbVar3 & 7) == 0) && (((ulong)pbVar2 & 7) == 0)) {
        if ((byte)pbVar2[10] <= (byte)pbVar3[8]) {
LAB_001d123b:
          if ((pbVar2[0xb] !=
               (btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                )0x0) &&
             (pbVar2[0xb] !=
              (btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
               )0xf)) {
            __assert_fail("parent->max_count() == kNodeValues",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                          ,0x86e,
                          "void gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Loop *, std::pair<int, bool>, std::less<S2Loop *>, std::allocator<std::pair<S2Loop *const, std::pair<int, bool>>>, 256, false>>::rebalance_or_split(iterator *) [Params = gtl::internal_btree::map_params<S2Loop *, std::pair<int, bool>, std::less<S2Loop *>, std::allocator<std::pair<S2Loop *const, std::pair<int, bool>>>, 256, false>]"
                         );
          }
          if (pbVar2[10] ==
              (btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
               )0xf) {
            pbVar3 = iter->node;
            if (((ulong)pbVar3 & 7) != 0) {
              __function = 
              "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop *, std::pair<int, bool>, std::less<S2Loop *>, std::allocator<std::pair<S2Loop *const, std::pair<int, bool>>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2Loop *, std::pair<int, bool>>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop *, std::pair<int, bool>, std::less<S2Loop *>, std::allocator<std::pair<S2Loop *const, std::pair<int, bool>>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop *, std::pair<int, bool>, std::less<S2Loop *>, std::allocator<std::pair<S2Loop *const, std::pair<int, bool>>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2Loop *, std::pair<int, bool>>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop *, std::pair<int, bool>, std::less<S2Loop *>, std::allocator<std::pair<S2Loop *const, std::pair<int, bool>>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
              ;
              goto LAB_001d137d;
            }
            local_38.node =
                 *(btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                   **)pbVar3;
            local_38.position = (int)(byte)pbVar3[8];
            rebalance_or_split(this,&local_38);
          }
          goto LAB_001d1277;
        }
        pbVar3 = btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                 ::child(pbVar2,(byte)pbVar3[8] + 1);
        if (((ulong)pbVar3 & 7) == 0) {
          if ((pbVar3[0xb] !=
               (btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                )0x0) &&
             (pbVar3[0xb] !=
              (btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
               )0xf)) {
            __assert_fail("right->max_count() == kNodeValues",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                          ,0x854,
                          "void gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Loop *, std::pair<int, bool>, std::less<S2Loop *>, std::allocator<std::pair<S2Loop *const, std::pair<int, bool>>>, 256, false>>::rebalance_or_split(iterator *) [Params = gtl::internal_btree::map_params<S2Loop *, std::pair<int, bool>, std::less<S2Loop *>, std::allocator<std::pair<S2Loop *const, std::pair<int, bool>>>, 256, false>]"
                         );
          }
          bVar7 = pbVar3[10];
          if (0xe < (byte)bVar7) goto LAB_001d123b;
          bVar5 = (byte)(0xfU - (char)bVar7) >> (0 < iter->position);
          bVar6 = 1;
          if (1 < bVar5) {
            bVar6 = bVar5;
          }
          pbVar1 = iter->node;
          if (((ulong)pbVar1 & 7) == 0) {
            if (((int)((uint)(byte)pbVar1[10] - (uint)bVar6) < iter->position) &&
               (0xe < (byte)(bVar6 + (char)bVar7))) goto LAB_001d123b;
            btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
            ::rebalance_left_to_right(pbVar1,(uint)bVar6,pbVar3,(allocator_type *)this);
            pbVar2 = iter->node;
            if (((ulong)pbVar2 & 7) == 0) {
              if ((int)(uint)(byte)pbVar2[10] < iter->position) {
                iter->position = iter->position + ~(uint)(byte)pbVar2[10];
                iter->node = pbVar3;
                pbVar2 = pbVar3;
              }
              bVar7 = (btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                       )0xf;
              if (pbVar2[0xb] !=
                  (btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                   )0x0) {
                bVar7 = pbVar2[0xb];
              }
              if ((byte)pbVar2[10] < (byte)bVar7) {
                return;
              }
              __assert_fail("node->count() < node->max_count()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                            ,0x866,
                            "void gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Loop *, std::pair<int, bool>, std::less<S2Loop *>, std::allocator<std::pair<S2Loop *const, std::pair<int, bool>>>, 256, false>>::rebalance_or_split(iterator *) [Params = gtl::internal_btree::map_params<S2Loop *, std::pair<int, bool>, std::less<S2Loop *>, std::allocator<std::pair<S2Loop *const, std::pair<int, bool>>>, 256, false>]"
                           );
            }
          }
        }
      }
    }
  }
LAB_001d1368:
  __function = 
  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop *, std::pair<int, bool>, std::less<S2Loop *>, std::allocator<std::pair<S2Loop *const, std::pair<int, bool>>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2Loop *, std::pair<int, bool>>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop *, std::pair<int, bool>, std::less<S2Loop *>, std::allocator<std::pair<S2Loop *const, std::pair<int, bool>>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop *, std::pair<int, bool>, std::less<S2Loop *>, std::allocator<std::pair<S2Loop *const, std::pair<int, bool>>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2Loop *, std::pair<int, bool>>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Loop *, std::pair<int, bool>, std::less<S2Loop *>, std::allocator<std::pair<S2Loop *const, std::pair<int, bool>>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
  ;
LAB_001d137d:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                ,0x1e1,__function);
}

Assistant:

void btree<P>::rebalance_or_split(iterator *iter) {
  node_type *&node = iter->node;
  int &insert_position = iter->position;
  assert(node->count() == node->max_count());
  assert(kNodeValues == node->max_count());

  // First try to make room on the node by rebalancing.
  node_type *parent = node->parent();
  if (node != root()) {
    if (node->position() > 0) {
      // Try rebalancing with our left sibling.
      node_type *left = parent->child(node->position() - 1);
      assert(left->max_count() == kNodeValues);
      if (left->count() < kNodeValues) {
        // We bias rebalancing based on the position being inserted. If we're
        // inserting at the end of the right node then we bias rebalancing to
        // fill up the left node.
        int to_move = (kNodeValues - left->count()) /
                      (1 + (insert_position < kNodeValues));
        to_move = std::max(1, to_move);

        if (((insert_position - to_move) >= 0) ||
            ((left->count() + to_move) < kNodeValues)) {
          left->rebalance_right_to_left(to_move, node, mutable_allocator());

          assert(node->max_count() - node->count() == to_move);
          insert_position = insert_position - to_move;
          if (insert_position < 0) {
            insert_position = insert_position + left->count() + 1;
            node = left;
          }

          assert(node->count() < node->max_count());
          return;
        }
      }
    }

    if (node->position() < parent->count()) {
      // Try rebalancing with our right sibling.
      node_type *right = parent->child(node->position() + 1);
      assert(right->max_count() == kNodeValues);
      if (right->count() < kNodeValues) {
        // We bias rebalancing based on the position being inserted. If we're
        // inserting at the beginning of the left node then we bias rebalancing
        // to fill up the right node.
        int to_move =
            (kNodeValues - right->count()) / (1 + (insert_position > 0));
        to_move = std::max(1, to_move);

        if ((insert_position <= (node->count() - to_move)) ||
            ((right->count() + to_move) < kNodeValues)) {
          node->rebalance_left_to_right(to_move, right, mutable_allocator());

          if (insert_position > node->count()) {
            insert_position = insert_position - node->count() - 1;
            node = right;
          }

          assert(node->count() < node->max_count());
          return;
        }
      }
    }

    // Rebalancing failed, make sure there is room on the parent node for a new
    // value.
    assert(parent->max_count() == kNodeValues);
    if (parent->count() == kNodeValues) {
      iterator parent_iter(node->parent(), node->position());
      rebalance_or_split(&parent_iter);
    }
  } else {
    // Rebalancing not possible because this is the root node.
    // Create a new root node and set the current root node as the child of the
    // new root.
    parent = new_internal_node(parent);
    parent->init_child(0, root());
    mutable_root() = parent;
    // If the former root was a leaf node, then it's now the rightmost node.
    assert(!parent->child(0)->leaf() || parent->child(0) == rightmost_);
  }

  // Split the node.
  node_type *split_node;
  if (node->leaf()) {
    split_node = new_leaf_node(parent);
    node->split(insert_position, split_node, mutable_allocator());
    if (rightmost_ == node) rightmost_ = split_node;
  } else {
    split_node = new_internal_node(parent);
    node->split(insert_position, split_node, mutable_allocator());
  }

  if (insert_position > node->count()) {
    insert_position = insert_position - node->count() - 1;
    node = split_node;
  }
}